

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharable.cc
# Opt level: O1

void __thiscall xemmai::t_sharable::f_share(t_sharable *this)

{
  pthread_rwlock_t *__rwlock;
  wchar_t *in_RDX;
  long in_FS_OFFSET;
  wstring_view a_message;
  
  if ((this->super_t_owned).v_owner == *(t_queue<128UL> **)(in_FS_OFFSET + -0x68)) {
    __rwlock = (pthread_rwlock_t *)
               t_lock_with_safe_region<std::shared_mutex>::f_lock(&this->v_mutex);
    (this->super_t_owned).v_owner = (t_queue<128UL> *)0x0;
    pthread_rwlock_unlock(__rwlock);
    return;
  }
  a_message._M_str = in_RDX;
  a_message._M_len = (size_t)L"not owned.";
  f_throw((xemmai *)0xa,a_message);
}

Assistant:

void t_sharable::f_share()
{
	if (v_owner != t_slot::t_increments::v_instance) f_throw(L"not owned."sv);
	t_lock_with_safe_region lock(v_mutex);
	v_owner = nullptr;
}